

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

Iterator * __thiscall
TTD::TTEventList::GetIteratorAtFirst(Iterator *__return_storage_ptr__,TTEventList *this)

{
  TTEventListLink *local_18;
  TTEventListLink *firstBlock;
  TTEventList *this_local;
  
  if (this->m_headBlock == (TTEventListLink *)0x0) {
    Iterator::Iterator(__return_storage_ptr__,(TTEventListLink *)0x0,0,this->m_vtable,
                       &this->m_previousEventMap);
  }
  else {
    for (local_18 = this->m_headBlock; local_18->Previous != (TTEventListLink *)0x0;
        local_18 = local_18->Previous) {
    }
    Iterator::Iterator(__return_storage_ptr__,local_18,local_18->StartPos,this->m_vtable,
                       &this->m_previousEventMap);
  }
  return __return_storage_ptr__;
}

Assistant:

TTEventList::Iterator TTEventList::GetIteratorAtFirst() const
    {
        if(this->m_headBlock == nullptr)
        {
            return Iterator(nullptr, 0, this->m_vtable, &this->m_previousEventMap);
        }
        else
        {
            TTEventListLink* firstBlock = this->m_headBlock;
            while(firstBlock->Previous != nullptr)
            {
                firstBlock = firstBlock->Previous;
            }

            return Iterator(firstBlock, firstBlock->StartPos, this->m_vtable, &this->m_previousEventMap);
        }
    }